

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ExplicitImportSymbol::serializeTo(ExplicitImportSymbol *this,ASTSerializer *serializer)

{
  PackageSymbol *pPVar1;
  Symbol *pSVar2;
  ASTSerializer *in_RSI;
  long in_RDI;
  ExplicitImportSymbol *in_stack_00000018;
  Symbol *sym;
  PackageSymbol *pkg;
  Symbol *in_stack_00000088;
  ASTSerializer *in_stack_00000090;
  undefined1 in_stack_00000098 [16];
  ExplicitImportSymbol *in_stack_ffffffffffffff90;
  ASTSerializer *in_stack_ffffffffffffff98;
  ASTSerializer *this_00;
  undefined4 local_20;
  undefined8 local_18;
  
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff98);
  ASTSerializer::write(this_00,local_20,local_18,(ulong)(*(byte *)(in_RDI + 0x60) & 1));
  pPVar1 = package(in_stack_ffffffffffffff90);
  if (pPVar1 != (PackageSymbol *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RSI);
    ASTSerializer::writeLink(in_stack_00000090,(string_view)in_stack_00000098,in_stack_00000088);
    in_stack_ffffffffffffff98 = in_RSI;
  }
  pSVar2 = importedSymbol(in_stack_00000018);
  if (pSVar2 != (Symbol *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff98);
    ASTSerializer::writeLink(in_stack_00000090,(string_view)in_stack_00000098,in_stack_00000088);
  }
  return;
}

Assistant:

void ExplicitImportSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isFromExport", isFromExport);
    if (auto pkg = package())
        serializer.writeLink("package", *pkg);

    if (auto sym = importedSymbol())
        serializer.writeLink("import", *sym);
}